

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O3

bool __thiscall
soul::HTMLGenerator::replaceTemplatePlaceholder
          (HTMLGenerator *this,CompileMessageList *errors,string *templateCode,string *placeholder,
          string *replacement)

{
  pointer pcVar1;
  string_view firstReplacement;
  size_type sVar2;
  _Alloc_hider _Var3;
  string_view firstToReplace;
  char *pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  CodeLocation local_48;
  
  pcVar4 = (templateCode->_M_dataplus)._M_p;
  _Var3._M_p = (pointer)templateCode->_M_string_length;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff78,
                     (placeholder->_M_dataplus)._M_p,0,placeholder->_M_string_length);
  if (sVar2 == 0xffffffffffffffff) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff78,"Template doesn\'t contain placeholder ",placeholder);
    local_48.sourceCode.object = (SourceCodeText *)0x0;
    local_48.location.data = (char *)0x0;
    CompileMessageList::addError(errors,(string *)&stack0xffffffffffffff78,&local_48);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p == &local_78) goto LAB_00246c33;
  }
  else {
    pcVar1 = (templateCode->_M_dataplus)._M_p;
    local_68[0] = &local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,pcVar1,pcVar1 + templateCode->_M_string_length);
    firstReplacement._M_str = pcVar4;
    firstReplacement._M_len = (size_t)_Var3._M_p;
    firstToReplace._M_str = (char *)replacement->_M_string_length;
    firstToReplace._M_len = (size_t)(placeholder->_M_dataplus)._M_p;
    choc::text::replace<std::__cxx11::string>
              ((string *)&stack0xffffffffffffff78,(text *)local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               placeholder->_M_string_length,firstToReplace,firstReplacement);
    std::__cxx11::string::operator=((string *)templateCode,(string *)&stack0xffffffffffffff78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != &local_78) {
      operator_delete(_Var3._M_p,local_78._M_allocated_capacity + 1);
    }
    local_78._M_allocated_capacity = local_58._M_allocated_capacity;
    _Var3._M_p = (pointer)local_68[0];
    if (local_68[0] == &local_58) goto LAB_00246c33;
  }
  operator_delete(_Var3._M_p,local_78._M_allocated_capacity + 1);
LAB_00246c33:
  return sVar2 != 0xffffffffffffffff;
}

Assistant:

bool replaceTemplatePlaceholder (soul::CompileMessageList& errors,
                                     std::string& templateCode,
                                     const std::string& placeholder,
                                     const std::string& replacement)
    {
        if (! choc::text::contains (templateCode, placeholder))
        {
            errors.addError ("Template doesn't contain placeholder " + placeholder, {});
            return false;
        }

        templateCode = choc::text::replace (templateCode, placeholder, replacement);
        return true;
    }